

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

void websocket_attach(intptr_t uuid,http_settings_s *http_settings,websocket_settings_s *args,
                     void *data,size_t length)

{
  uint8_t timeout;
  ws_s *owner;
  int *piVar1;
  buffer_s bVar2;
  undefined4 local_e6;
  undefined2 local_e2;
  undefined4 uStack_47;
  uint uStack_43;
  
  owner = (ws_s *)malloc(0xb8);
  uStack_43 = (uint)(uint3)uStack_43;
  (owner->protocol).on_data = on_data_first;
  (owner->protocol).on_ready = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
  (owner->protocol).on_shutdown = on_shutdown;
  (owner->protocol).on_close = on_close;
  (owner->protocol).ping = ws_ping;
  (owner->protocol).rsv = 0;
  owner->fd = uuid;
  owner->on_message = (_func_void_ws_s_ptr_fio_str_info_s_uint8_t *)0x0;
  owner->on_shutdown = (_func_void_ws_s_ptr *)0x0;
  owner->on_ready = (_func_void_ws_s_ptr *)0x0;
  owner->on_open = (_func_void_ws_s_ptr *)0x0;
  owner->on_close = (_func_void_intptr_t_void_ptr *)0x0;
  owner->udata = (void *)0x0;
  owner->max_msg_size = 0;
  (owner->subscriptions).prev = &owner->subscriptions;
  (owner->subscriptions).next = &owner->subscriptions;
  (owner->subscriptions).obj = (void *)0x0;
  owner->sub_lock = '\0';
  *(undefined1 *)((long)&(owner->buffer).size + 7) = 0;
  *(undefined2 *)((long)&(owner->buffer).size + 5) = 0;
  *(undefined4 *)((long)&(owner->buffer).size + 1) = 0;
  *(undefined4 *)&owner->field_0x89 = uStack_47;
  *(uint *)&owner->field_0x8d = uStack_43;
  *(undefined4 *)((long)&(owner->buffer).data + 1) = 0;
  *(undefined4 *)((long)&(owner->buffer).data + 5) = 0;
  owner->length = 0;
  owner->msg = 0;
  owner->is_text = '\0';
  owner->is_client = '\0';
  *(undefined2 *)&owner->field_0xb6 = local_e2;
  *(undefined4 *)&owner->field_0xb2 = local_e6;
  if (owner == (ws_s *)0x0) {
    if (0 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR(
                    "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/websockets.c:333"
                    );
    }
    kill(0,2);
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  bVar2 = create_ws_buffer(owner);
  owner->buffer = bVar2;
  owner->on_open = args->on_open;
  owner->on_close = args->on_close;
  owner->on_message = args->on_message;
  owner->on_ready = args->on_ready;
  owner->on_shutdown = args->on_shutdown;
  owner->udata = args->udata;
  if (http_settings == (http_settings_s *)0x0) {
    owner->max_msg_size = 0x40000;
    timeout = '(';
  }
  else {
    owner->is_client = http_settings->is_client;
    owner->max_msg_size = http_settings->ws_max_msg_size;
    timeout = http_settings->ws_timeout;
  }
  fio_timeout_set(uuid,timeout);
  if (length != 0 && data != (void *)0x0) {
    if ((owner->buffer).size < length) {
      (owner->buffer).size = length;
      bVar2.size = length;
      bVar2.data = (owner->buffer).data;
      bVar2 = resize_ws_buffer(owner,bVar2);
      owner->buffer = bVar2;
      if (bVar2.data == (void *)0x0) {
        fio_attach(uuid,(fio_protocol_s *)owner);
        websocket_close(owner);
        return;
      }
    }
    memcpy((owner->buffer).data,data,length);
    owner->length = length;
  }
  fio_attach(uuid,(fio_protocol_s *)owner);
  fio_force_event(uuid,FIO_EVENT_ON_DATA);
  return;
}

Assistant:

void websocket_attach(intptr_t uuid, http_settings_s *http_settings,
                      websocket_settings_s *args, void *data, size_t length) {
  ws_s *ws = new_websocket(uuid);
  FIO_ASSERT_ALLOC(ws);
  // we have an active websocket connection - prep the connection buffer
  ws->buffer = create_ws_buffer(ws);
  // Setup ws callbacks
  ws->on_open = args->on_open;
  ws->on_close = args->on_close;
  ws->on_message = args->on_message;
  ws->on_ready = args->on_ready;
  ws->on_shutdown = args->on_shutdown;
  // setup any user data
  ws->udata = args->udata;
  if (http_settings) {
    // client mode?
    ws->is_client = http_settings->is_client;
    // buffer limits
    ws->max_msg_size = http_settings->ws_max_msg_size;
    // update the timeout
    fio_timeout_set(uuid, http_settings->ws_timeout);
  } else {
    ws->max_msg_size = (1024 * 256);
    fio_timeout_set(uuid, 40);
  }

  if (data && length) {
    if (length > ws->buffer.size) {
      ws->buffer.size = length;
      ws->buffer = resize_ws_buffer(ws, ws->buffer);
      if (!ws->buffer.data) {
        // no memory.
        fio_attach(uuid, (fio_protocol_s *)ws);
        websocket_close(ws);
        return;
      }
    }
    memcpy(ws->buffer.data, data, length);
    ws->length = length;
  }
  // update the protocol object, cleaning up the old one
  fio_attach(uuid, (fio_protocol_s *)ws);
  // allow the on_open and on_data to take over the control.
  fio_force_event(uuid, FIO_EVENT_ON_DATA);
}